

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kiste2cpp.cpp
# Opt level: O3

segment_t * kiste::parse_command(segment_t *__return_storage_ptr__,string *line,size_t pos)

{
  byte bVar1;
  ulong uVar2;
  int iVar3;
  parse_error *this;
  runtime_error *this_00;
  segment_type type;
  char *pcVar4;
  char *pcVar5;
  size_t pos_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  uVar2 = line->_M_string_length;
  if (uVar2 == pos) {
    this = (parse_error *)__cxa_allocate_exception(0x10);
    parse_error::parse_error(this,"Missing command after \'$\'");
    goto LAB_00104883;
  }
  if (pos < uVar2) {
    bVar1 = (line->_M_dataplus)._M_p[pos];
    if (bVar1 < 0x7b) {
      if (bVar1 == 0x24) {
        __return_storage_ptr__->_end_pos = pos;
        __return_storage_ptr__->_type = text;
        (__return_storage_ptr__->_text)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_text).field_2;
        pcVar5 = "$";
        pcVar4 = "";
LAB_00104827:
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&__return_storage_ptr__->_text,pcVar5,pcVar4);
        return __return_storage_ptr__;
      }
      if (bVar1 == 0x25) {
        __return_storage_ptr__->_end_pos = pos;
        __return_storage_ptr__->_type = text;
        (__return_storage_ptr__->_text)._M_dataplus._M_p =
             (pointer)&(__return_storage_ptr__->_text).field_2;
        pcVar5 = "%";
        pcVar4 = "";
        goto LAB_00104827;
      }
    }
    else {
      if (bVar1 == 0x7b) {
        pos_00 = pos + 1;
        type = escape;
        goto LAB_0010484d;
      }
      if (bVar1 == 0x7c) {
        if (uVar2 - 1 == pos) {
          __return_storage_ptr__->_end_pos = pos;
          __return_storage_ptr__->_type = trim_trailing_return;
          (__return_storage_ptr__->_text)._M_dataplus._M_p =
               (pointer)&(__return_storage_ptr__->_text).field_2;
          pcVar4 = "";
          pcVar5 = "";
          goto LAB_00104827;
        }
        goto LAB_001048aa;
      }
    }
    std::__cxx11::string::substr((ulong)&local_70,(ulong)line);
    iVar3 = std::__cxx11::string::compare((char *)&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    if (iVar3 == 0) {
      pos_00 = pos + 4;
      type = raw;
    }
    else {
      std::__cxx11::string::substr((ulong)&local_70,(ulong)line);
      iVar3 = std::__cxx11::string::compare((char *)&local_70);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      if (iVar3 != 0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::string::substr((ulong)&local_50,(ulong)line);
        std::operator+(&local_70,"Unknown command: ",&local_50);
        std::runtime_error::runtime_error(this_00,(string *)&local_70);
        *(undefined ***)this_00 = &PTR__runtime_error_0010cd88;
        __cxa_throw(this_00,&parse_error::typeinfo,std::runtime_error::~runtime_error);
      }
      pos_00 = pos + 5;
      type = call;
    }
LAB_0010484d:
    parse_expression(__return_storage_ptr__,line,type,pos_00);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("basic_string::at: __n (which is %zu) >= this->size() (which is %zu)",pos);
LAB_001048aa:
  this = (parse_error *)__cxa_allocate_exception(0x10);
  parse_error::parse_error(this,"Trailing characters after trim-right ($|)");
LAB_00104883:
  __cxa_throw(this,&parse_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto parse_command(const std::string& line, std::size_t pos) -> segment_t
  {
    // std::clog << "----------------------------------" << std::endl;
    // std::clog << "line: " << line.substr(pos) << std::endl;
    if (pos == line.size())
    {
      throw parse_error("Missing command after '$'");
    }
    else if (line.at(pos) == '$')
    {
      return {pos, segment_type::text, "$"};
    }
    else if (line.at(pos) == '%')
    {
      return {pos, segment_type::text, "%"};
    }
    else if (line.at(pos) == '|')
    {
      if (pos != line.size() - 1)
      {
        throw parse_error("Trailing characters after trim-right ($|)");
      }
      return {pos, segment_type::trim_trailing_return, ""};
    }
    else if (line.at(pos) == '{')
    {
      return parse_expression(line, segment_type::escape, pos + 1);
    }
    else if (line.substr(pos, 4) == "raw{")
    {
      return parse_expression(line, segment_type::raw, pos + 4);
    }
    else if (line.substr(pos, 5) == "call{")
    {
      return parse_expression(line, segment_type::call, pos + 5);
    }
    else
    {
      throw parse_error("Unknown command: " + line.substr(pos));
    }
  }